

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getPrefixMultiplier2Char(char c1,char c2)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  pair<unsigned_short,_double> *ppVar3;
  char in_SIL;
  char in_DIL;
  pair<unsigned_short,_double> *fnd;
  uint16_t code;
  double local_30;
  pair<unsigned_short,_double> local_28;
  pair<unsigned_short,_double> *local_18;
  uint16_t local_c [2];
  double local_8;
  
  local_c[0] = charindex(in_DIL,in_SIL);
  pvVar1 = std::array<std::pair<unsigned_short,_double>,_25UL>::begin
                     ((array<std::pair<unsigned_short,_double>,_25UL> *)0x7a53f4);
  pvVar2 = std::array<std::pair<unsigned_short,_double>,_25UL>::end
                     ((array<std::pair<unsigned_short,_double>,_25UL> *)0x7a5405);
  local_30 = 0.0;
  std::pair<unsigned_short,_double>::pair<unsigned_short_&,_double,_true>
            (&local_28,local_c,&local_30);
  ppVar3 = std::
           lower_bound<std::pair<unsigned_short,double>const*,std::pair<unsigned_short,double>,units::getPrefixMultiplier2Char(char,char)::__0>
                     (pvVar1,pvVar2,&local_28);
  local_18 = ppVar3;
  pvVar1 = std::array<std::pair<unsigned_short,_double>,_25UL>::end
                     ((array<std::pair<unsigned_short,_double>,_25UL> *)0x7a5456);
  if ((ppVar3 == pvVar1) || (local_18->first != local_c[0])) {
    local_8 = 0.0;
  }
  else {
    local_8 = local_18->second;
  }
  return local_8;
}

Assistant:

static double getPrefixMultiplier2Char(char c1, char c2)
{
    using cpair = std::pair<uint16_t, double>;
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<cpair, 25> char2prefix{{
        cpair{charindex('D', 'A'), precise::deka.multiplier()},
        cpair{charindex('E', 'X'), precise::exa.multiplier()},
        cpair{charindex('E', 'i'), precise::exbi.multiplier()},
        cpair{charindex('G', 'A'), precise::giga.multiplier()},
        cpair{charindex('G', 'i'), precise::gibi.multiplier()},
        cpair{charindex('K', 'i'), precise::kibi.multiplier()},
        cpair{charindex('M', 'A'), precise::mega.multiplier()},
        cpair{charindex('M', 'M'), precise::mega.multiplier()},
        cpair{charindex('M', 'i'), precise::mebi.multiplier()},
        cpair{charindex('P', 'T'), precise::peta.multiplier()},
        cpair{charindex('P', 'i'), precise::pebi.multiplier()},
        cpair{charindex('T', 'R'), precise::tera.multiplier()},
        cpair{charindex('T', 'i'), precise::tebi.multiplier()},
        cpair{charindex('Y', 'A'), precise::yotta.multiplier()},
        cpair{charindex('Y', 'O'), precise::yocto.multiplier()},
        cpair{charindex('Y', 'i'), precise::yobi.multiplier()},
        cpair{charindex('R', 'i'), precise::robi.multiplier()},
        cpair{charindex('Q', 'i'), precise::qubi.multiplier()},
        cpair{charindex('Z', 'A'), precise::zetta.multiplier()},
        cpair{charindex('Z', 'O'), precise::zepto.multiplier()},
        cpair{charindex('Z', 'i'), precise::zebi.multiplier()},
        cpair{charindex('d', 'a'), precise::deka.multiplier()},
        cpair{charindex('m', 'A'), precise::mega.multiplier()},
        cpair{charindex('m', 'c'), precise::micro.multiplier()},
        cpair{charindex('p', 'T'), precise::peta.multiplier()},
    }};
    auto code = charindex(c1, c2);
    // NOLINTNEXTLINE (readability-qualified-auto)
    const auto fnd = std::lower_bound(
        char2prefix.begin(),
        char2prefix.end(),
        cpair{code, 0.0},
        [](const cpair& p, const cpair& test) {
            return (p.first < test.first);
        });

    if (fnd != char2prefix.end() && fnd->first == code) {
        return fnd->second;
    }
    return 0.0;
}